

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::message(QMakeEvaluator *this,int type,QString *msg)

{
  QMakeHandler *pQVar1;
  ProFile *pPVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->m_handler;
  if ((this->m_current).line == 0) {
    local_28.d = (Data *)0x0;
    local_28.ptr = (char16_t *)0x0;
    local_28.size = 0;
  }
  else {
    pPVar2 = (this->m_current).pro;
    local_28.d = (pPVar2->m_fileName).d.d;
    local_28.ptr = (pPVar2->m_fileName).d.ptr;
    local_28.size = (pPVar2->m_fileName).d.size;
    if (local_28.d != (Data *)0x0) {
      LOCK();
      ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  (*(code *)**(undefined8 **)pQVar1)();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::message(int type, const QString &msg) const
{
    if (!m_skipLevel)
        m_handler->message(type | (m_cumulative ? QMakeHandler::CumulativeEvalMessage : 0), msg,
                m_current.line ? m_current.pro->fileName() : QString(),
                m_current.line != 0xffff ? m_current.line : -1);
}